

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_allocator.cpp
# Opt level: O0

void __thiscall
duckdb::TupleDataAllocator::InitializeChunkStateInternal
          (TupleDataAllocator *this,TupleDataPinState *pin_state,TupleDataChunkState *chunk_state,
          idx_t offset,bool recompute,bool init_heap_pointers,bool init_heap_sizes,
          unsafe_vector<reference<TupleDataChunkPart>_> *parts)

{
  uint uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  reference this_00;
  Value *pVVar4;
  idx_t iVar5;
  data_ptr_t pdVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  long lVar8;
  idx_t in_RCX;
  long in_RSI;
  long in_RDI;
  byte in_R8B;
  byte in_R9B;
  byte in_stack_00000008;
  undefined7 in_stack_00000009;
  idx_t in_stack_00000010;
  Vector *in_stack_00000018;
  data_ptr_t *in_stack_00000020;
  SelectionVector *in_stack_00000028;
  Vector *in_stack_00000030;
  TupleDataLayout *in_stack_00000040;
  idx_t in_stack_00000048;
  idx_t idx;
  idx_t i_1;
  Vector new_heap_ptrs;
  Vector old_heap_ptrs;
  data_ptr_t old_base_heap_ptr;
  lock_guard<std::mutex> guard;
  data_ptr_t new_base_heap_ptr;
  idx_t i;
  data_ptr_t base_row_ptr;
  idx_t row_width;
  uint32_t next;
  TupleDataChunkPart *part;
  reference_wrapper<duckdb::TupleDataChunkPart> *part_ref;
  iterator __end1;
  iterator __begin1;
  unsafe_vector<reference<TupleDataChunkPart>_> *__range1;
  uchar **heap_locations;
  unsigned_long *heap_sizes;
  uchar **row_locations;
  TupleDataPinState *in_stack_fffffffffffffd58;
  TupleDataAllocator *in_stack_fffffffffffffd60;
  uchar **in_stack_fffffffffffffd68;
  TupleDataChunkPart *in_stack_fffffffffffffd70;
  idx_t in_stack_fffffffffffffd78;
  ulong in_stack_fffffffffffffd80;
  Value *in_stack_fffffffffffffd88;
  Vector *in_stack_fffffffffffffd90;
  uintptr_t in_stack_fffffffffffffd98;
  ulong local_208;
  ulong local_88;
  __normal_iterator<std::reference_wrapper<duckdb::TupleDataChunkPart>_*,_std::vector<std::reference_wrapper<duckdb::TupleDataChunkPart>,_std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>_>_>_>
  local_50 [2];
  uchar **local_40;
  TupleDataChunkPart *local_38;
  uchar **local_30;
  byte local_23;
  byte local_22;
  byte local_21;
  idx_t local_20;
  long local_10;
  
  local_21 = in_R8B & 1;
  local_22 = in_R9B & 1;
  local_23 = in_stack_00000008 & 1;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_30 = FlatVector::GetData<unsigned_char*>((Vector *)0x16438ab);
  local_38 = (TupleDataChunkPart *)FlatVector::GetData<unsigned_long>((Vector *)0x16438c7);
  local_40 = FlatVector::GetData<unsigned_char*>((Vector *)0x16438e3);
  local_50[0]._M_current =
       (reference_wrapper<duckdb::TupleDataChunkPart> *)
       ::std::
       vector<std::reference_wrapper<duckdb::TupleDataChunkPart>,_std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>_>_>
       ::begin((vector<std::reference_wrapper<duckdb::TupleDataChunkPart>,_std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>_>_>
                *)in_stack_fffffffffffffd58);
  ::std::
  vector<std::reference_wrapper<duckdb::TupleDataChunkPart>,_std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>_>_>
  ::end((vector<std::reference_wrapper<duckdb::TupleDataChunkPart>,_std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>_>_>
         *)in_stack_fffffffffffffd58);
  while (bVar3 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::reference_wrapper<duckdb::TupleDataChunkPart>_*,_std::vector<std::reference_wrapper<duckdb::TupleDataChunkPart>,_std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>_>_>_>
                             *)in_stack_fffffffffffffd60,
                            (__normal_iterator<std::reference_wrapper<duckdb::TupleDataChunkPart>_*,_std::vector<std::reference_wrapper<duckdb::TupleDataChunkPart>,_std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>_>_>_>
                             *)in_stack_fffffffffffffd58), bVar3) {
    this_00 = __gnu_cxx::
              __normal_iterator<std::reference_wrapper<duckdb::TupleDataChunkPart>_*,_std::vector<std::reference_wrapper<duckdb::TupleDataChunkPart>,_std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>_>_>_>
              ::operator*(local_50);
    pVVar4 = (Value *)::std::reference_wrapper<duckdb::TupleDataChunkPart>::get(this_00);
    uVar1 = *(uint *)&pVVar4->field_0x1c;
    iVar5 = TupleDataLayout::GetRowWidth(*(TupleDataLayout **)(in_RDI + 0x18));
    pdVar6 = GetRowPointer(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                           (TupleDataChunkPart *)0x16439b8);
    for (local_88 = 0; local_88 < uVar1; local_88 = local_88 + 1) {
      local_30[local_20 + local_88] = pdVar6 + local_88 * iVar5;
    }
    bVar3 = TupleDataLayout::AllConstant(*(TupleDataLayout **)(in_RDI + 0x18));
    if (bVar3) {
      local_20 = uVar1 + local_20;
    }
    else if (*(uint32_t *)&pVVar4->is_null == 0) {
      if ((local_23 & 1) != 0) {
        TupleDataLayout::GetHeapSizeOffset(*(TupleDataLayout **)(in_RDI + 0x18));
        InitializeHeapSizes((data_ptr_t *)in_stack_fffffffffffffd90,
                            (idx_t *)in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                            in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
                            (idx_t)in_stack_fffffffffffffd68);
      }
      local_20 = uVar1 + local_20;
    }
    else {
      if ((((local_21 & 1) != 0) && (*(char *)(local_10 + 0x30) != '\x04')) &&
         (p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   GetBaseHeapPointer(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                                      (TupleDataChunkPart *)0x1643b48),
         (pVVar4->type_).type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
         p_Var7)) {
        ::std::reference_wrapper::operator_cast_to_mutex_
                  ((reference_wrapper<std::mutex> *)0x1643b7b);
        ::std::lock_guard<std::mutex>::lock_guard
                  ((lock_guard<std::mutex> *)in_stack_fffffffffffffd60,
                   (mutex_type *)in_stack_fffffffffffffd58);
        p_Var2 = (pVVar4->type_).type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        if (p_Var2 != p_Var7) {
          CastPointerToValue<unsigned_char>
                    ((uchar *)((long)&p_Var2->_vptr__Sp_counted_base +
                              (ulong)*(uint32_t *)
                                      ((long)&(pVVar4->type_).type_info_.internal.
                                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr + 4)));
          Value::POINTER(in_stack_fffffffffffffd98);
          Vector::Vector(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
          Value::~Value((Value *)in_stack_fffffffffffffd60);
          in_stack_fffffffffffffd98 =
               CastPointerToValue<unsigned_char>
                         ((uchar *)((long)&p_Var7->_vptr__Sp_counted_base +
                                   (ulong)*(uint32_t *)
                                           ((long)&(pVVar4->type_).type_info_.internal.
                                                                                                      
                                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr + 4)));
          Value::POINTER(in_stack_fffffffffffffd98);
          Vector::Vector(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
          Value::~Value((Value *)in_stack_fffffffffffffd60);
          in_stack_fffffffffffffd90 = (Vector *)ConstantVector::ZeroSelectionVector();
          in_stack_fffffffffffffd58 = *(TupleDataPinState **)(in_RDI + 0x18);
          in_stack_fffffffffffffd60 = (TupleDataAllocator *)0x0;
          RecomputeHeapPointers
                    (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018,
                     in_stack_00000010,CONCAT71(in_stack_00000009,in_stack_00000008),
                     in_stack_00000040,in_stack_00000048);
          (pVVar4->type_).type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               p_Var7;
          Vector::~Vector((Vector *)in_stack_fffffffffffffd60);
          Vector::~Vector((Vector *)in_stack_fffffffffffffd60);
        }
        ::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1643daa);
      }
      if ((local_23 & 1) != 0) {
        in_stack_fffffffffffffd80 = (ulong)uVar1;
        in_stack_fffffffffffffd68 = local_30;
        in_stack_fffffffffffffd70 = local_38;
        in_stack_fffffffffffffd78 = local_20;
        in_stack_fffffffffffffd88 = pVVar4;
        TupleDataLayout::GetHeapSizeOffset(*(TupleDataLayout **)(in_RDI + 0x18));
        InitializeHeapSizes((data_ptr_t *)in_stack_fffffffffffffd90,
                            (idx_t *)in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                            in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
                            (idx_t)in_stack_fffffffffffffd68);
      }
      if ((local_22 & 1) != 0) {
        local_40[local_20] =
             (uchar *)((long)&((pVVar4->type_).type_info_.internal.
                               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi)->_vptr__Sp_counted_base +
                      (ulong)*(uint32_t *)
                              ((long)&(pVVar4->type_).type_info_.internal.
                                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + 4));
        for (local_208 = 1; local_208 < uVar1; local_208 = local_208 + 1) {
          lVar8 = local_20 + local_208;
          local_40[lVar8] =
               local_40[lVar8 + -1] + *(unsigned_long *)((long)local_38 + (lVar8 + -1) * 8);
        }
      }
      local_20 = uVar1 + local_20;
    }
    __gnu_cxx::
    __normal_iterator<std::reference_wrapper<duckdb::TupleDataChunkPart>_*,_std::vector<std::reference_wrapper<duckdb::TupleDataChunkPart>,_std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>_>_>_>
    ::operator++(local_50);
  }
  return;
}

Assistant:

void TupleDataAllocator::InitializeChunkStateInternal(TupleDataPinState &pin_state, TupleDataChunkState &chunk_state,
                                                      idx_t offset, bool recompute, bool init_heap_pointers,
                                                      bool init_heap_sizes,
                                                      unsafe_vector<reference<TupleDataChunkPart>> &parts) {
	auto row_locations = FlatVector::GetData<data_ptr_t>(chunk_state.row_locations);
	auto heap_sizes = FlatVector::GetData<idx_t>(chunk_state.heap_sizes);
	auto heap_locations = FlatVector::GetData<data_ptr_t>(chunk_state.heap_locations);

	for (auto &part_ref : parts) {
		auto &part = part_ref.get();
		const auto next = part.count;

		// Set up row locations for the scan
		const auto row_width = layout.GetRowWidth();
		const auto base_row_ptr = GetRowPointer(pin_state, part);
		for (idx_t i = 0; i < next; i++) {
			row_locations[offset + i] = base_row_ptr + i * row_width;
		}

		if (layout.AllConstant()) { // Can't have a heap
			offset += next;
			continue;
		}

		if (part.total_heap_size == 0) {
			if (init_heap_sizes) { // No heap, but we need the heap sizes
				InitializeHeapSizes(row_locations, heap_sizes, offset, next, part, layout.GetHeapSizeOffset());
			}
			offset += next;
			continue;
		}

		// Check if heap block has changed - re-compute the pointers within each row if so
		if (recompute && pin_state.properties != TupleDataPinProperties::ALREADY_PINNED) {
			const auto new_base_heap_ptr = GetBaseHeapPointer(pin_state, part);
			if (part.base_heap_ptr != new_base_heap_ptr) {
				lock_guard<mutex> guard(part.lock);
				const auto old_base_heap_ptr = part.base_heap_ptr;
				if (old_base_heap_ptr != new_base_heap_ptr) {
					Vector old_heap_ptrs(
					    Value::POINTER(CastPointerToValue(old_base_heap_ptr + part.heap_block_offset)));
					Vector new_heap_ptrs(
					    Value::POINTER(CastPointerToValue(new_base_heap_ptr + part.heap_block_offset)));
					RecomputeHeapPointers(old_heap_ptrs, *ConstantVector::ZeroSelectionVector(), row_locations,
					                      new_heap_ptrs, offset, next, layout, 0);
					part.base_heap_ptr = new_base_heap_ptr;
				}
			}
		}

		if (init_heap_sizes) {
			InitializeHeapSizes(row_locations, heap_sizes, offset, next, part, layout.GetHeapSizeOffset());
		}

		if (init_heap_pointers) {
			// Set the pointers where the heap data will be written (if needed)
			heap_locations[offset] = part.base_heap_ptr + part.heap_block_offset;
			for (idx_t i = 1; i < next; i++) {
				auto idx = offset + i;
				heap_locations[idx] = heap_locations[idx - 1] + heap_sizes[idx - 1];
			}
		}

		offset += next;
	}
	D_ASSERT(offset <= STANDARD_VECTOR_SIZE);
}